

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O0

PVG_FT_Outline * ft_outline_create(int points,int contours)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  PVG_FT_Outline *pPVar4;
  PVG_FT_Outline *pPVar5;
  PVG_FT_Byte *outline_data;
  PVG_FT_Outline *outline;
  size_t contours_flag_size;
  size_t contours_size;
  size_t tags_size;
  size_t points_size;
  int contours_local;
  int points_local;
  
  lVar1 = (long)(points + contours) * 0x10;
  uVar2 = (long)(points + contours) + 7U & 0xfffffffffffffff8;
  uVar3 = (long)contours * 4 + 7U & 0xfffffffffffffff8;
  pPVar4 = (PVG_FT_Outline *)
           malloc(lVar1 + uVar2 + uVar3 + ((long)contours + 7U & 0xfffffffffffffff8) + 0x30);
  pPVar5 = pPVar4 + 1;
  pPVar4->points = (PVG_FT_Vector *)pPVar5;
  pPVar4->tags = (char *)(&pPVar5->n_contours + (long)(points + contours) * 4);
  pPVar4->contours = (int *)((long)&pPVar5->n_contours + uVar2 + lVar1);
  pPVar4->contours_flag = (char *)((long)&pPVar5->n_contours + uVar3 + uVar2 + lVar1);
  pPVar4->n_points = 0;
  pPVar4->n_contours = 0;
  pPVar4->flags = 0;
  return pPVar4;
}

Assistant:

static PVG_FT_Outline* ft_outline_create(int points, int contours)
{
    size_t points_size = ALIGN_SIZE((points + contours) * sizeof(PVG_FT_Vector));
    size_t tags_size = ALIGN_SIZE((points + contours) * sizeof(char));
    size_t contours_size = ALIGN_SIZE(contours * sizeof(int));
    size_t contours_flag_size = ALIGN_SIZE(contours * sizeof(char));
    PVG_FT_Outline* outline = malloc(points_size + tags_size + contours_size + contours_flag_size + sizeof(PVG_FT_Outline));

    PVG_FT_Byte* outline_data = (PVG_FT_Byte*)(outline + 1);
    outline->points = (PVG_FT_Vector*)(outline_data);
    outline->tags = (char*)(outline_data + points_size);
    outline->contours = (int*)(outline_data + points_size + tags_size);
    outline->contours_flag = (char*)(outline_data + points_size + tags_size + contours_size);
    outline->n_points = 0;
    outline->n_contours = 0;
    outline->flags = 0x0;
    return outline;
}